

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void add2P(int v)

{
  _WordT *p_Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar7 = (ulong)v;
  if (14999 < (uint)v) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar7,15000);
  }
  p_Var1 = P.super__Base_bitset<235UL>._M_w + (uVar7 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
  sizeP = sizeP + 1;
  uVar9 = (ulong)(uint)v;
  if ((Cp.super__Base_bitset<235UL>._M_w[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
    std::bitset<15000UL>::reset(&Cm,uVar7);
    piVar4 = NAdjB;
    CE_Cm_Cm = CE_Cm_Cm - CE_Cm_[uVar7];
    CE_Cm_Cp = CE_Cm_Cp - CE_Cp_[uVar7];
    lVar5 = (long)NAdjP[uVar7];
    iVar2 = NAdjP[uVar9 + 1];
    if (NAdjP[uVar7] < iVar2) {
      do {
        CE_Cm_[piVar4[lVar5]] = CE_Cm_[piVar4[lVar5]] + -1;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
  }
  else {
    std::bitset<15000UL>::reset(&Cp,uVar7);
    piVar4 = NAdjB;
    CE_Cp_Cp = CE_Cp_Cp - CE_Cp_[uVar7];
    CE_Cp_P = CE_Cp_P - CE_P_[uVar7];
    CE_Cm_Cp = CE_Cm_Cp - CE_Cm_[uVar7];
    lVar5 = (long)NAdjP[uVar7];
    iVar2 = NAdjP[uVar9 + 1];
    if (NAdjP[uVar7] < iVar2) {
      do {
        CE_Cp_[piVar4[lVar5]] = CE_Cp_[piVar4[lVar5]] + -1;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
  }
  sizeC = sizeC + -1;
  CE_P_P = CE_P_P + CE_P_[uVar7];
  lVar5 = (long)cnt_lP;
  cnt_lP = cnt_lP + 1;
  lP[lVar5] = v;
  piVar4 = AdjB;
  lVar5 = (long)AdjP[uVar7];
  iVar2 = AdjP[uVar9 + 1];
  if (AdjP[uVar7] < iVar2) {
    do {
      iVar3 = piVar4[lVar5];
      neiC[iVar3] = neiC[iVar3] + -1;
      neiP[iVar3] = neiP[iVar3] + 1;
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  lVar5 = (long)NAdjP[uVar7];
  if (NAdjP[uVar7] < NAdjP[uVar9 + 1]) {
    piVar4 = NAdjB + lVar5;
    lVar10 = lVar5 * 4;
    do {
      lVar10 = lVar10 + 4;
      iVar2 = *piVar4;
      uVar8 = (ulong)iVar2;
      uVar7 = Cm.super__Base_bitset<235UL>._M_w[uVar8 >> 6];
      uVar6 = 1L << ((byte)iVar2 & 0x3f);
      if (((uVar7 >> (uVar8 & 0x3f) & 1) != 0) ||
         ((Cp.super__Base_bitset<235UL>._M_w[uVar8 >> 6] & uVar6) != 0)) {
        CE_Cp_P = CE_Cp_P + 1;
      }
      if (((uVar7 & uVar6) != 0) && (CE_P_[uVar8] == 0)) {
        add_from_Cm_to_Cp(iVar2);
      }
      CE_P_[uVar8] = CE_P_[uVar8] + 1;
      lVar5 = lVar5 + 1;
      piVar4 = (int *)((long)NAdjB + lVar10);
    } while (lVar5 < NAdjP[uVar9 + 1]);
  }
  return;
}

Assistant:

inline void add2P(int v) {
    P.set(v); ++sizeP;
    if(Cp[v]) {Cp.reset(v); out_Cp(v);}
    else {Cm.reset(v); out_Cm(v);}
    --sizeC;

    CE_P_P += CE_P_[v];
    lP[cnt_lP++] = v;

    FOR_NA(v, u) {--neiC[u]; ++neiP[u];}

    FOR_C_NA(v, u) {
        if (Cm[u] || Cp[u]) ++CE_Cp_P;
        if (CE_P_[u] == 0 && Cm[u])
            add_from_Cm_to_Cp(u);
        ++CE_P_[u];
    }
}